

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int local_1c;
  int i;
  char **argv_local;
  int argc_local;
  
  for (local_1c = 0; local_1c < ntests; local_1c = local_1c + 1) {
    printf("%s\n",tests[local_1c].name);
    (*tests[local_1c].fn)();
  }
  printf("PASS\n");
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  for (int i = 0; i < ntests; i++) {
    printf("%s\n", tests[i].name);
    tests[i].fn();
  }
  printf("PASS\n");
  return 0;
}